

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O1

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *
jsoncons::jsonpointer::get<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *root,
          basic_json_pointer<char> *location,error_code *ec)

{
  pointer pbVar1;
  pointer pbVar2;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
  local_30;
  
  pbVar2 = (location->tokens_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (location->tokens_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 != pbVar1) {
    do {
      local_30.int64_.val_ = (int64_t)(pbVar2->_M_dataplus)._M_p;
      local_30._0_8_ = pbVar2->_M_string_length;
      root = detail::
             resolve<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                       ((detail *)root,
                        (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                        &local_30.common_,(string_view_type *)ec,
                        (error_code *)local_30.long_str_.ptr_);
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != pbVar1 && ec->_M_value == 0);
  }
  return root;
}

Assistant:

const Json& get(const Json& root, 
                    const basic_json_pointer<typename Json::char_type>& location, 
                    std::error_code& ec)
    {
        if (location.empty())
        {
            return root;
        }

        const Json* current = std::addressof(root);
        auto it = location.begin();
        auto end = location.end();
        while (it != end)
        {
            current = jsoncons::jsonpointer::detail::resolve(current, *it, ec);
            if (JSONCONS_UNLIKELY(ec))
                return *current;
            ++it;
        }
        return *current;
    }